

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Add_DoubleHelper
              (double dblLeft,Var addRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  double dVar3;
  
  bVar1 = TaggedInt::Is(addRight);
  if (bVar1) {
    dVar3 = (double)(int)addRight;
  }
  else {
    if ((ulong)addRight >> 0x32 == 0) {
      pvVar2 = JavascriptNumber::ToVarMaybeInPlace(dblLeft,scriptContext,result);
      pvVar2 = Add_Full(pvVar2,addRight,scriptContext);
      return pvVar2;
    }
    dVar3 = JavascriptNumber::GetValue(addRight);
  }
  pvVar2 = JavascriptNumber::ToVarMaybeInPlace(dVar3 + dblLeft,scriptContext,result);
  return pvVar2;
}

Assistant:

Var inline JavascriptMath::Add_DoubleHelper(double dblLeft, Var addRight, ScriptContext* scriptContext, JavascriptNumber*result)
        {
            if (TaggedInt::Is(addRight))
            {
                double sum =  dblLeft + TaggedInt::ToDouble(addRight);

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(addRight))
            {
                double sum = dblLeft + JavascriptNumber::GetValue(addRight);

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else
            {
                Var aLeft = JavascriptNumber::ToVarMaybeInPlace(dblLeft, scriptContext, result);

                return Add_Full(aLeft, addRight, scriptContext);
            }
        }